

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O1

void enet_peer_reset_queues(ENetPeer *peer)

{
  ENetChannel *pEVar1;
  void *__ptr;
  ENetIncomingCommand *in_RCX;
  _ENetListNode *position;
  ENetChannel *__ptr_00;
  ENetListIterator startCommand;
  ENetListIterator pEVar2;
  
  if ((peer->flags & 1) != 0) {
    enet_list_remove(&peer->dispatchList);
    *(byte *)&peer->flags = (byte)peer->flags & 0xfe;
  }
  position = (peer->acknowledgements).sentinel.next;
  while (position != &(peer->acknowledgements).sentinel) {
    __ptr = enet_list_remove(position);
    enet_free(__ptr);
    position = (peer->acknowledgements).sentinel.next;
  }
  enet_peer_reset_outgoing_commands(&peer->sentReliableCommands);
  enet_peer_reset_outgoing_commands(&peer->sentUnreliableCommands);
  enet_peer_reset_outgoing_commands(&peer->outgoingCommands);
  enet_peer_remove_incoming_commands
            ((ENetList *)(peer->dispatchedCommands).sentinel.next,
             &(peer->dispatchedCommands).sentinel,(ENetListIterator)0x0,in_RCX);
  pEVar1 = peer->channels;
  if ((pEVar1 != (ENetChannel *)0x0) && (peer->channelCount != 0)) {
    __ptr_00 = peer->channels;
    if (pEVar1 < __ptr_00 + peer->channelCount) {
      startCommand = &(pEVar1->incomingUnreliableCommands).sentinel;
      do {
        enet_peer_remove_incoming_commands
                  ((ENetList *)startCommand[-1].next,startCommand + -1,(ENetListIterator)0x0,in_RCX)
        ;
        enet_peer_remove_incoming_commands
                  ((ENetList *)startCommand->next,startCommand,(ENetListIterator)0x0,in_RCX);
        __ptr_00 = peer->channels;
        in_RCX = (ENetIncomingCommand *)(startCommand + 5);
        pEVar2 = startCommand + 1;
        startCommand = (ENetListIterator)in_RCX;
      } while (pEVar2 < __ptr_00 + peer->channelCount);
    }
    enet_free(__ptr_00);
  }
  peer->channels = (ENetChannel *)0x0;
  peer->channelCount = 0;
  return;
}

Assistant:

void
enet_peer_reset_queues (ENetPeer * peer)
{
    ENetChannel * channel;

    if (peer -> flags & ENET_PEER_FLAG_NEEDS_DISPATCH)
    {
       enet_list_remove (& peer -> dispatchList);

       peer -> flags &= ~ ENET_PEER_FLAG_NEEDS_DISPATCH;
    }

    while (! enet_list_empty (& peer -> acknowledgements))
      enet_free (enet_list_remove (enet_list_begin (& peer -> acknowledgements)));

    enet_peer_reset_outgoing_commands (& peer -> sentReliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> sentUnreliableCommands);
    enet_peer_reset_outgoing_commands (& peer -> outgoingCommands);
    enet_peer_reset_incoming_commands (& peer -> dispatchedCommands);

    if (peer -> channels != NULL && peer -> channelCount > 0)
    {
        for (channel = peer -> channels;
             channel < & peer -> channels [peer -> channelCount];
             ++ channel)
        {
            enet_peer_reset_incoming_commands (& channel -> incomingReliableCommands);
            enet_peer_reset_incoming_commands (& channel -> incomingUnreliableCommands);
        }

        enet_free (peer -> channels);
    }

    peer -> channels = NULL;
    peer -> channelCount = 0;
}